

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method_putcdata(lua_State *L)

{
  MSize len_00;
  CTState *cts;
  void *pvStack_60;
  MSize len;
  char *p;
  SBufExt *sbx;
  lua_State *L_local;
  CTState *cts_1;
  undefined4 local_34;
  CTState *local_30;
  undefined4 local_24;
  CTState *local_20;
  SBufExt *local_18;
  SBufExt *sbx_1;
  
  sbx = (SBufExt *)L;
  sbx_1 = (SBufExt *)L;
  p = (char *)buffer_tobuf(L);
  (((SBufExt *)p)->L).ptr64 = (ulong)sbx_1 | (((SBufExt *)p)->L).ptr64 & 7;
  local_18 = (SBufExt *)p;
  if ((int)((long)*(undefined8 *)((long)sbx->field_4 + 8) >> 0x2f) == -0xb) {
    cts_1 = (CTState *)sbx;
    L_local = *(lua_State **)(sbx->b + 0x180);
    ((CTState *)L_local)->L = (lua_State *)sbx;
    local_34 = 0x12;
    local_24 = 0x12;
    local_30 = (CTState *)L_local;
    local_20 = (CTState *)L_local;
    lj_cconv_ct_tv((CTState *)L_local,((CTState *)L_local)->tab + 0x12,
                   (uint8_t *)&stack0xffffffffffffffa0,(TValue *)((long)sbx->field_4 + 8),0x200);
    len_00 = lj_lib_checkintrange((lua_State *)sbx,3,0,0x7fffff00);
    lj_buf_putmem((SBuf *)p,pvStack_60,len_00);
    sbx->r = (char *)((long)sbx->field_4 + 8);
    return 1;
  }
  lj_err_argtype((lua_State *)sbx,2,"cdata");
}

Assistant:

LJLIB_CF(buffer_method_putcdata)	LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  const char *p;
  MSize len;
  if (tviscdata(L->base+1)) {
    CTState *cts = ctype_cts(L);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p,
		   L->base+1, CCF_ARG(2));
  } else {
    lj_err_argtype(L, 2, "cdata");
  }
  len = (MSize)lj_lib_checkintrange(L, 3, 0, LJ_MAX_BUF);
  lj_buf_putmem((SBuf *)sbx, p, len);
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}